

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsPipeline.cpp
# Opt level: O3

Ptr<GraphicsPipeline> __thiscall
myvk::GraphicsPipeline::Create
          (GraphicsPipeline *this,Ptr<PipelineLayout> *pipeline_layout,Ptr<RenderPass> *render_pass,
          VkGraphicsPipelineCreateInfo *create_info)

{
  element_type *peVar1;
  VkDevice pVVar2;
  PFN_vkCreateGraphicsPipelines p_Var3;
  int iVar4;
  VkResult VVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  Ptr<GraphicsPipeline> PVar7;
  VkGraphicsPipelineCreateInfo new_info;
  _func_int **local_c8;
  element_type *peStack_c0;
  VkGraphicsPipelineCreateInfo local_b8;
  
  std::__shared_ptr<myvk::GraphicsPipeline,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::GraphicsPipeline>>
            ((__shared_ptr<myvk::GraphicsPipeline,(__gnu_cxx::_Lock_policy)2> *)&local_c8,
             (allocator<myvk::GraphicsPipeline> *)&local_b8);
  local_c8[3] = (_func_int *)
                (pipeline_layout->
                super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 4),
             &(pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_refcount);
  local_c8[6] = (_func_int *)
                (render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 7),
             &(render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  memcpy(&local_b8,create_info,0x90);
  p_Var3 = vkCreateGraphicsPipelines;
  local_b8.renderPass =
       ((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_render_pass;
  peVar1 = (pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_b8.layout = peVar1->m_pipeline_layout;
  iVar4 = (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  pVVar2 = *(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar4) + 0x268);
  iVar4 = (*(((pipeline_layout->super___shared_ptr<myvk::PipelineLayout,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar5 = (*p_Var3)(pVVar2,*(VkPipelineCache *)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x270),1,
                    &local_b8,(VkAllocationCallbacks *)0x0,(VkPipeline *)(local_c8 + 5));
  _Var6._M_pi = extraout_RDX;
  if (VVar5 == VK_SUCCESS) {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = local_c8;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_c0;
  }
  else {
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_PipelineBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    if (peStack_c0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_c0);
      _Var6._M_pi = extraout_RDX_00;
    }
  }
  PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<GraphicsPipeline>)
         PVar7.super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<GraphicsPipeline> GraphicsPipeline::Create(const Ptr<PipelineLayout> &pipeline_layout,
                                               const Ptr<RenderPass> &render_pass,
                                               const VkGraphicsPipelineCreateInfo &create_info) {
	auto ret = std::make_shared<GraphicsPipeline>();
	ret->m_pipeline_layout_ptr = pipeline_layout;
	ret->m_render_pass_ptr = render_pass;

	VkGraphicsPipelineCreateInfo new_info = create_info;
	new_info.renderPass = render_pass->GetHandle();
	new_info.layout = pipeline_layout->GetHandle();

	if (vkCreateGraphicsPipelines(pipeline_layout->GetDevicePtr()->GetHandle(),
	                              pipeline_layout->GetDevicePtr()->GetPipelineCacheHandle(), 1, &new_info, nullptr,
	                              &ret->m_pipeline) != VK_SUCCESS)
		return nullptr;
	return ret;
}